

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Sub::Sub<std::__cxx11::string>
          (Sub *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->key_).field_2;
  (this->key_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (key->_M_dataplus)._M_p;
  paVar2 = &key->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&key->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->key_).field_2 + 8) = uVar4;
  }
  else {
    (this->key_)._M_dataplus._M_p = pcVar3;
    (this->key_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->key_)._M_string_length = key->_M_string_length;
  (key->_M_dataplus)._M_p = (pointer)paVar2;
  key->_M_string_length = 0;
  (key->field_2)._M_local_buf[0] = '\0';
  ValueImpl<true>::ValueImpl<std::__cxx11::string,void>(&this->value_,value);
  (this->annotation_).
  super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload.
  super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
  super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged = false;
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}